

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read_preamble
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  bool bVar1;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  runtime_error *prVar2;
  unsigned_long *puVar3;
  fpos<__mbstate_t> local_150;
  fpos<__mbstate_t> local_140;
  unsigned_long local_130 [3];
  unsigned_long read_size;
  __mbstate_t local_110;
  unsigned_long local_108;
  unsigned_long header_size;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  unsigned_long local_98;
  unsigned_long read_bom;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<char,_8UL> local_18;
  array<char,_8UL> read_magic_bytes;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  
  read_magic_bytes._M_elems = (_Type)this;
  local_18 = File<hta::storage::file::Metric::Header,hta::TimeAggregate>::read<std::array<char,8ul>>
                       ((File<hta::storage::file::Metric::Header,hta::TimeAggregate> *)this);
  __first1 = std::array<char,_8UL>::begin(&local_18);
  __last1 = std::array<char,_8UL>::end(&local_18);
  __first2 = std::array<char,_8UL>::begin(&magic_bytes);
  bVar1 = std::equal<char_const*,char_const*>(__first1,__last1,__first2);
  if (!bVar1) {
    read_bom._7_1_ = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    s_abi_cxx11_(&local_58,"Magic bytes of file do not match. Invalid or corrupt file:",0x3a);
    std::filesystem::__cxx11::path::string(&local_88,&this->filename_);
    std::operator+(&local_38,&local_58,&local_88);
    std::runtime_error::runtime_error(prVar2,(string *)&local_38);
    read_bom._7_1_ = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = read<unsigned_long>(this);
  if (local_98 != 0xf8f9fafbfcfdfeff) {
    header_size._7_1_ = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    s_abi_cxx11_(&local_d8,"Byte order mark does not match. File written with different endianess: "
                 ,0x47);
    std::filesystem::__cxx11::path::string(&local_f8,&this->filename_);
    std::operator+(&local_b8,&local_d8,&local_f8);
    std::runtime_error::runtime_error(prVar2,(string *)&local_b8);
    header_size._7_1_ = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_108 = read<unsigned_long>(this);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&read_size,local_108 + 0x18);
  (this->data_begin_)._M_off = read_size;
  (this->data_begin_)._M_state = local_110;
  local_130[1] = 0x38;
  std::fpos<__mbstate_t>::fpos(&local_140,0x18);
  local_130[0] = std::fpos<__mbstate_t>::operator-(&this->data_begin_,&local_140);
  puVar3 = std::min<unsigned_long>(local_130 + 1,local_130);
  local_130[2] = *puVar3;
  std::fpos<__mbstate_t>::fpos(&local_150,0x18);
  std::istream::seekg(&this->stream_,local_150._M_off,local_150._M_state);
  check_stream(this,"seekg header");
  std::istream::read((char *)&this->stream_,(long)&this->header_);
  check_stream(this,"read header");
  Metric::Header::restore(&this->header_,local_130[2]);
  return;
}

Assistant:

void read_preamble()
    {
        const auto read_magic_bytes = read<std::array<char, 8>>();
        if (!std::equal(read_magic_bytes.begin(), read_magic_bytes.end(), magic_bytes.begin()))
        {
            throw std::runtime_error("Magic bytes of file do not match. Invalid or corrupt file:"s +
                                     filename_.string());
        }
        const auto read_bom = read<uint64_t>();
        if (read_bom != byte_order_mark)
        {
            throw std::runtime_error("Byte order mark does not match. File written with "
                                     "different endianess: "s +
                                     filename_.string());
        }

        const auto header_size = read<uint64_t>();
        data_begin_ = header_begin_ + header_size;

        auto read_size =
            std::min<size_t>(sizeof(header_), data_begin_ - static_cast<pos_type>(header_begin_));
        stream_.seekg(header_begin_);
        check_stream("seekg header");
        stream_.read(reinterpret_cast<char*>(&header_), read_size);
        check_stream("read header");
        header_.restore(read_size);
    }